

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagnosticsReporter_Parser.cpp
# Opt level: O0

void __thiscall
psy::C::Parser::DiagnosticsReporter::ExpectedFollowOfStructDeclarator(DiagnosticsReporter *this)

{
  initializer_list<psy::C::SyntaxKind> __l;
  SyntaxToken *this_00;
  char *__rhs;
  vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *validTkKinds_00;
  string local_1e0 [39];
  allocator<char> local_1b9;
  string local_1b8 [32];
  string local_198 [32];
  DiagnosticDescriptor local_178;
  allocator<psy::C::SyntaxKind> local_f9;
  iterator local_f8;
  size_type sStack_f0;
  undefined1 local_e0 [24];
  string local_c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  undefined1 local_48 [8];
  string s;
  initializer_list<psy::C::SyntaxKind> validTkKinds;
  DiagnosticsReporter *this_local;
  
  s.field_2._10_2_ = 100;
  s.field_2._12_2_ = 0x1d;
  s.field_2._14_2_ = 0x57;
  local_f8 = (iterator)((long)&s.field_2 + 10);
  sStack_f0 = 3;
  std::allocator<psy::C::SyntaxKind>::allocator(&local_f9);
  __l._M_len = sStack_f0;
  __l._M_array = local_f8;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)local_e0,__l,
             &local_f9);
  joinTokenNames_abi_cxx11_
            ((string *)(local_e0 + 0x18),(DiagnosticsReporter *)local_e0,validTkKinds_00);
  std::operator+(&local_a8,"expected ",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 (local_e0 + 0x18));
  std::operator+(&local_88,&local_a8,"after field declarator, got `");
  this_00 = peek(this->parser_,1);
  __rhs = SyntaxToken::valueText_c_str(this_00);
  std::operator+(&local_68,&local_88,__rhs);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48,
                 &local_68,"\'");
  std::__cxx11::string::~string((string *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)(local_e0 + 0x18));
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)local_e0);
  std::allocator<psy::C::SyntaxKind>::~allocator(&local_f9);
  std::__cxx11::string::string
            (local_198,(string *)&ID_of_ExpectedFollowOfStructDeclarator_abi_cxx11_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_1b8,"[[unexpected Follow of field declarator]]",&local_1b9);
  std::__cxx11::string::string(local_1e0,(string *)local_48);
  psy::DiagnosticDescriptor::DiagnosticDescriptor(&local_178,local_198,local_1b8,local_1e0,2,1);
  diagnoseOrDelayDiagnostic(this,&local_178);
  DiagnosticDescriptor::~DiagnosticDescriptor(&local_178);
  std::__cxx11::string::~string(local_1e0);
  std::__cxx11::string::~string(local_1b8);
  std::allocator<char>::~allocator(&local_1b9);
  std::__cxx11::string::~string(local_198);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void Parser::DiagnosticsReporter::ExpectedFollowOfStructDeclarator()
{
    auto validTkKinds = { SyntaxKind::CommaToken,
                          SyntaxKind::SemicolonToken,
                          SyntaxKind::ColonToken };

    std::string s = "expected "
            + joinTokenNames(validTkKinds)
            + "after field declarator, got `"
            + parser_->peek().valueText_c_str()
            + "'";

    diagnoseOrDelayDiagnostic(
                DiagnosticDescriptor(ID_of_ExpectedFollowOfStructDeclarator,
                                     "[[unexpected Follow of field declarator]]",
                                     s,
                                     DiagnosticSeverity::Error,
                                     DiagnosticCategory::Syntax));
}